

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::compute::anon_unknown_0::BufferToBufferInvertTest::initPrograms
          (BufferToBufferInvertTest *this,SourceCollections *sourceCollections)

{
  int iVar1;
  ostream *poVar2;
  ProgramSources *this_00;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  SourceCollections *sourceCollections_local;
  BufferToBufferInvertTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (this->m_bufferType == BUFFER_TYPE_UNIFORM) {
    poVar2 = std::operator<<((ostream *)local_190,"#version 310 es\n");
    poVar2 = std::operator<<(poVar2,"layout (local_size_x = ");
    iVar1 = tcu::Vector<int,_3>::x(&this->m_localSize);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,", local_size_y = ");
    iVar1 = tcu::Vector<int,_3>::y(&this->m_localSize);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,", local_size_z = ");
    iVar1 = tcu::Vector<int,_3>::z(&this->m_localSize);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") in;\n");
    poVar2 = std::operator<<(poVar2,"layout(binding = 0) readonly uniform Input {\n");
    poVar2 = std::operator<<(poVar2,"    uint values[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_numValues);
    poVar2 = std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(poVar2,"} ub_in;\n");
    poVar2 = std::operator<<(poVar2,"layout(binding = 1, std140) writeonly buffer Output {\n");
    poVar2 = std::operator<<(poVar2,"    uint values[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_numValues);
    poVar2 = std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(poVar2,"} sb_out;\n");
    poVar2 = std::operator<<(poVar2,"void main (void) {\n");
    poVar2 = std::operator<<(poVar2,
                             "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n");
    poVar2 = std::operator<<(poVar2,
                             "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n"
                            );
    poVar2 = std::operator<<(poVar2,
                             "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                            );
    poVar2 = std::operator<<(poVar2,"    uint offset          = numValuesPerInv*groupNdx;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
    poVar2 = std::operator<<(poVar2,
                             "        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n")
    ;
    std::operator<<(poVar2,"}\n");
  }
  else if (this->m_bufferType == BUFFER_TYPE_SSBO) {
    poVar2 = std::operator<<((ostream *)local_190,"#version 310 es\n");
    poVar2 = std::operator<<(poVar2,"layout (local_size_x = ");
    iVar1 = tcu::Vector<int,_3>::x(&this->m_localSize);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,", local_size_y = ");
    iVar1 = tcu::Vector<int,_3>::y(&this->m_localSize);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,", local_size_z = ");
    iVar1 = tcu::Vector<int,_3>::z(&this->m_localSize);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") in;\n");
    poVar2 = std::operator<<(poVar2,"layout(binding = 0, std140) readonly buffer Input {\n");
    poVar2 = std::operator<<(poVar2,"    uint values[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_numValues);
    poVar2 = std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(poVar2,"} sb_in;\n");
    poVar2 = std::operator<<(poVar2,"layout (binding = 1, std140) writeonly buffer Output {\n");
    poVar2 = std::operator<<(poVar2,"    uint values[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_numValues);
    poVar2 = std::operator<<(poVar2,"];\n");
    poVar2 = std::operator<<(poVar2,"} sb_out;\n");
    poVar2 = std::operator<<(poVar2,"void main (void) {\n");
    poVar2 = std::operator<<(poVar2,
                             "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n");
    poVar2 = std::operator<<(poVar2,
                             "    uint numValuesPerInv = uint(sb_in.values.length()) / (size.x*size.y*size.z);\n"
                            );
    poVar2 = std::operator<<(poVar2,
                             "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                            );
    poVar2 = std::operator<<(poVar2,"    uint offset          = numValuesPerInv*groupNdx;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
    poVar2 = std::operator<<(poVar2,
                             "        sb_out.values[offset + ndx] = ~sb_in.values[offset + ndx];\n")
    ;
    std::operator<<(poVar2,"}\n");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"comp",&local_1c1);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(this_00,&local_1f0);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void BufferToBufferInvertTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	if (m_bufferType == BUFFER_TYPE_UNIFORM)
	{
		src << "#version 310 es\n"
			<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
			<< "layout(binding = 0) readonly uniform Input {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} ub_in;\n"
			<< "layout(binding = 1, std140) writeonly buffer Output {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_out;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint numValuesPerInv = uint(ub_in.values.length()) / (size.x*size.y*size.z);\n"
			<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "    uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "        sb_out.values[offset + ndx] = ~ub_in.values[offset + ndx];\n"
			<< "}\n";
	}
	else if (m_bufferType == BUFFER_TYPE_SSBO)
	{
		src << "#version 310 es\n"
			<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
			<< "layout(binding = 0, std140) readonly buffer Input {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_in;\n"
			<< "layout (binding = 1, std140) writeonly buffer Output {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_out;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint numValuesPerInv = uint(sb_in.values.length()) / (size.x*size.y*size.z);\n"
			<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "    uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "        sb_out.values[offset + ndx] = ~sb_in.values[offset + ndx];\n"
			<< "}\n";
	}

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}